

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::ElementsDecodeLockingScript::ElementsDecodeLockingScript
          (ElementsDecodeLockingScript *this)

{
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  ElementsDecodeLockingScript *local_10;
  ElementsDecodeLockingScript *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::ElementsDecodeLockingScript>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ElementsDecodeLockingScript>);
  (this->super_JsonClassBase<cfd::js::api::json::ElementsDecodeLockingScript>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ElementsDecodeLockingScript_01b4c868;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->asm__,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hex_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  this->req_sigs_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->type_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->addresses_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->pegout_chain_,"",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->pegout_asm_,"",&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->pegout_hex_,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  this->pegout_req_sigs_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->pegout_type_,"",&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->pegout_addresses_);
  CollectFieldName();
  return;
}

Assistant:

ElementsDecodeLockingScript() {
    CollectFieldName();
  }